

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void __thiscall
embree::sse2::
BVHNIntersector1<4,_16777232,_true,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
::occluded(BVHNIntersector1<4,_16777232,_true,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
           *this,Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  Collider CVar19;
  long lVar20;
  ulong uVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  int iVar27;
  AABBNodeMB4D *node1;
  ulong uVar28;
  ulong uVar29;
  Intersectors *pIVar30;
  ulong *puVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  float fVar47;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar48 [16];
  float fVar52;
  float fVar55;
  float fVar56;
  undefined1 auVar53 [16];
  float fVar57;
  undefined1 auVar54 [16];
  float fVar58;
  float fVar62;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar63;
  float fVar64;
  float fVar71;
  float fVar73;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar72;
  float fVar74;
  undefined1 auVar70 [16];
  float fVar75;
  float fVar78;
  float fVar79;
  undefined1 auVar76 [16];
  float fVar80;
  undefined1 auVar77 [16];
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar92;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar93 [16];
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_a99;
  long local_a98;
  float fStack_a90;
  float fStack_a8c;
  Ray *local_a88;
  int local_a7c;
  undefined1 local_a78 [16];
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a5c;
  undefined8 local_a58;
  float fStack_a50;
  float fStack_a4c;
  undefined8 local_a48;
  float fStack_a40;
  float fStack_a3c;
  undefined8 local_a38;
  float fStack_a30;
  float fStack_a2c;
  undefined8 local_a28;
  float fStack_a20;
  float fStack_a1c;
  float local_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  undefined8 local_a08;
  float fStack_a00;
  float fStack_9fc;
  undefined8 local_9f8;
  float fStack_9f0;
  float fStack_9ec;
  RayQueryContext *local_9e8;
  RayQueryContext *local_9e0;
  undefined4 local_9d8;
  float local_9d4;
  float local_9d0;
  undefined4 local_9cc;
  undefined4 local_9c8;
  undefined4 local_9c4;
  uint local_9c0;
  undefined4 local_9bc;
  undefined4 local_9b8;
  int *local_9a8;
  undefined8 local_9a0;
  undefined4 *local_998;
  Intersectors *local_990;
  undefined4 *local_988;
  undefined4 local_980;
  float local_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  float local_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  undefined1 local_8f8 [16];
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  undefined1 local_8d8 [16];
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  undefined1 local_898 [16];
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 *local_858;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  float local_7f8 [4];
  float local_7e8 [4];
  ulong local_7d8;
  ulong local_7d0 [244];
  
  if ((*(ulong *)(*(long *)this + 0x70) != 8) &&
     (fVar83 = *(float *)&(This->intersector1).intersect, 0.0 <= fVar83)) {
    local_9f8 = local_7d0;
    local_7d8 = *(ulong *)(*(long *)this + 0x70);
    local_928 = *(float *)&This->ptr;
    local_938 = *(float *)((long)&This->ptr + 4);
    local_8e8 = *(float *)&This->leafIntersector;
    fVar99 = *(float *)((long)&This->leafIntersector + 4);
    CVar19 = This->collider;
    uVar35 = -(uint)(1e-18 <= ABS(CVar19.collide._0_4_));
    uVar36 = -(uint)(1e-18 <= ABS(CVar19.collide._4_4_));
    uVar39 = -(uint)(1e-18 <= ABS(CVar19.name._0_4_));
    uVar43 = -(uint)(1e-18 <= ABS(CVar19.name._4_4_));
    auVar65 = divps(_DAT_01f7ba10,(undefined1  [16])CVar19);
    auVar60._0_4_ = auVar65._0_4_ & uVar35;
    auVar60._4_4_ = auVar65._4_4_ & uVar36;
    auVar60._8_4_ = auVar65._8_4_ & uVar39;
    auVar60._12_4_ = auVar65._12_4_ & uVar43;
    auVar65._0_8_ = CONCAT44(~uVar36,~uVar35) & 0x5d5e0b6b5d5e0b6b;
    auVar65._8_4_ = ~uVar39 & 0x5d5e0b6b;
    auVar65._12_4_ = ~uVar43 & 0x5d5e0b6b;
    fVar88 = 0.0;
    if (0.0 <= fVar99) {
      fVar88 = fVar99;
    }
    auVar65 = auVar65 | auVar60;
    local_948 = auVar65._0_4_ * 0.99999964;
    local_958 = auVar65._4_4_ * 0.99999964;
    local_918 = auVar65._8_4_ * 0.99999964;
    local_968 = auVar65._0_4_ * 1.0000004;
    fVar99 = auVar65._4_4_ * 1.0000004;
    local_908 = auVar65._8_4_ * 1.0000004;
    local_a08 = (ulong)(local_948 < 0.0) << 4;
    uVar32 = (ulong)(local_958 < 0.0) << 4 | 0x20;
    uVar29 = (ulong)(local_918 < 0.0) << 4 | 0x40;
    uVar33 = local_a08 ^ 0x10;
    local_8f8._4_4_ = fVar88;
    local_8f8._0_4_ = fVar88;
    local_8f8._8_4_ = fVar88;
    local_8f8._12_4_ = fVar88;
    local_8d8._4_4_ = fVar83;
    local_8d8._0_4_ = fVar83;
    local_8d8._8_4_ = fVar83;
    local_8d8._12_4_ = fVar83;
    local_898 = mm_lookupmask_ps._240_16_;
    local_a58 = This;
    fStack_914 = local_918;
    fStack_910 = local_918;
    fStack_90c = local_918;
    fStack_924 = local_928;
    fStack_920 = local_928;
    fStack_91c = local_928;
    fStack_944 = local_948;
    fStack_940 = local_948;
    fStack_93c = local_948;
    fStack_954 = local_958;
    fStack_950 = local_958;
    fStack_94c = local_958;
    fStack_964 = local_968;
    fStack_960 = local_968;
    fStack_95c = local_968;
    fVar83 = fVar99;
    fVar88 = fVar99;
    fVar91 = fVar99;
    fStack_8e4 = local_8e8;
    fStack_8e0 = local_8e8;
    fStack_8dc = local_8e8;
    fStack_904 = local_908;
    fStack_900 = local_908;
    fStack_8fc = local_908;
    fStack_934 = local_938;
    fStack_930 = local_938;
    fStack_92c = local_938;
    local_a88 = ray;
    do {
      uVar34 = local_9f8[-1];
      local_9f8 = local_9f8 + -1;
      while ((uVar34 & 8) == 0) {
        fVar106 = *(float *)((long)&(local_a58->collider).name + 4);
        uVar28 = uVar34 & 0xfffffffffffffff0;
        pfVar8 = (float *)(uVar28 + 0x80 + local_a08);
        pfVar1 = (float *)(uVar28 + 0x20 + local_a08);
        auVar69._0_4_ = ((*pfVar8 * fVar106 + *pfVar1) - local_928) * local_948;
        auVar69._4_4_ = ((pfVar8[1] * fVar106 + pfVar1[1]) - fStack_924) * fStack_944;
        auVar69._8_4_ = ((pfVar8[2] * fVar106 + pfVar1[2]) - fStack_920) * fStack_940;
        auVar69._12_4_ = ((pfVar8[3] * fVar106 + pfVar1[3]) - fStack_91c) * fStack_93c;
        auVar65 = maxps(local_8f8,auVar69);
        pfVar8 = (float *)(uVar28 + 0x80 + uVar32);
        pfVar1 = (float *)(uVar28 + 0x20 + uVar32);
        auVar59._0_4_ = ((*pfVar8 * fVar106 + *pfVar1) - local_938) * local_958;
        auVar59._4_4_ = ((pfVar8[1] * fVar106 + pfVar1[1]) - fStack_934) * fStack_954;
        auVar59._8_4_ = ((pfVar8[2] * fVar106 + pfVar1[2]) - fStack_930) * fStack_950;
        auVar59._12_4_ = ((pfVar8[3] * fVar106 + pfVar1[3]) - fStack_92c) * fStack_94c;
        pfVar8 = (float *)(uVar28 + 0x80 + uVar29);
        pfVar1 = (float *)(uVar28 + 0x20 + uVar29);
        auVar66._0_4_ = ((*pfVar8 * fVar106 + *pfVar1) - local_8e8) * local_918;
        auVar66._4_4_ = ((pfVar8[1] * fVar106 + pfVar1[1]) - fStack_8e4) * fStack_914;
        auVar66._8_4_ = ((pfVar8[2] * fVar106 + pfVar1[2]) - fStack_8e0) * fStack_910;
        auVar66._12_4_ = ((pfVar8[3] * fVar106 + pfVar1[3]) - fStack_8dc) * fStack_90c;
        auVar60 = maxps(auVar59,auVar66);
        auVar65 = maxps(auVar65,auVar60);
        pfVar8 = (float *)(uVar28 + 0x80 + uVar33);
        pfVar1 = (float *)(uVar28 + 0x20 + uVar33);
        auVar67._0_4_ = ((*pfVar8 * fVar106 + *pfVar1) - local_928) * local_968;
        auVar67._4_4_ = ((pfVar8[1] * fVar106 + pfVar1[1]) - fStack_924) * fStack_964;
        auVar67._8_4_ = ((pfVar8[2] * fVar106 + pfVar1[2]) - fStack_920) * fStack_960;
        auVar67._12_4_ = ((pfVar8[3] * fVar106 + pfVar1[3]) - fStack_91c) * fStack_95c;
        auVar60 = minps(local_8d8,auVar67);
        pfVar8 = (float *)(uVar28 + 0x80 + (uVar32 ^ 0x10));
        pfVar1 = (float *)(uVar28 + 0x20 + (uVar32 ^ 0x10));
        auVar68._0_4_ = ((*pfVar8 * fVar106 + *pfVar1) - local_938) * fVar99;
        auVar68._4_4_ = ((pfVar8[1] * fVar106 + pfVar1[1]) - fStack_934) * fVar83;
        auVar68._8_4_ = ((pfVar8[2] * fVar106 + pfVar1[2]) - fStack_930) * fVar88;
        auVar68._12_4_ = ((pfVar8[3] * fVar106 + pfVar1[3]) - fStack_92c) * fVar91;
        pfVar8 = (float *)(uVar28 + 0x80 + (uVar29 ^ 0x10));
        pfVar1 = (float *)(uVar28 + 0x20 + (uVar29 ^ 0x10));
        auVar76._0_4_ = ((*pfVar8 * fVar106 + *pfVar1) - local_8e8) * local_908;
        auVar76._4_4_ = ((pfVar8[1] * fVar106 + pfVar1[1]) - fStack_8e4) * fStack_904;
        auVar76._8_4_ = ((pfVar8[2] * fVar106 + pfVar1[2]) - fStack_8e0) * fStack_900;
        auVar76._12_4_ = ((pfVar8[3] * fVar106 + pfVar1[3]) - fStack_8dc) * fStack_8fc;
        auVar69 = minps(auVar68,auVar76);
        auVar60 = minps(auVar60,auVar69);
        bVar22 = auVar65._0_4_ <= auVar60._0_4_;
        bVar23 = auVar65._4_4_ <= auVar60._4_4_;
        bVar24 = auVar65._8_4_ <= auVar60._8_4_;
        bVar25 = auVar65._12_4_ <= auVar60._12_4_;
        if (((uint)uVar34 & 7) == 6) {
          bVar22 = (fVar106 < *(float *)(uVar28 + 0xf0) && *(float *)(uVar28 + 0xe0) <= fVar106) &&
                   bVar22;
          bVar23 = (fVar106 < *(float *)(uVar28 + 0xf4) && *(float *)(uVar28 + 0xe4) <= fVar106) &&
                   bVar23;
          bVar24 = (fVar106 < *(float *)(uVar28 + 0xf8) && *(float *)(uVar28 + 0xe8) <= fVar106) &&
                   bVar24;
          bVar25 = (fVar106 < *(float *)(uVar28 + 0xfc) && *(float *)(uVar28 + 0xec) <= fVar106) &&
                   bVar25;
        }
        auVar53._0_4_ = (uint)bVar22 * -0x80000000;
        auVar53._4_4_ = (uint)bVar23 * -0x80000000;
        auVar53._8_4_ = (uint)bVar24 * -0x80000000;
        auVar53._12_4_ = (uint)bVar25 * -0x80000000;
        uVar35 = movmskps((int)context,auVar53);
        local_9e8 = (RayQueryContext *)(ulong)uVar35;
        if (uVar35 == 0) goto LAB_0019286d;
        context = (RayQueryContext *)(ulong)(byte)uVar35;
        lVar20 = 0;
        if (context != (RayQueryContext *)0x0) {
          for (; ((byte)uVar35 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
          }
        }
        uVar34 = *(ulong *)(uVar28 + lVar20 * 8);
        uVar35 = (uVar35 & 0xff) - 1 & uVar35 & 0xff;
        if (uVar35 != 0) {
          *local_9f8 = uVar34;
          local_9f8 = local_9f8 + 1;
          lVar20 = 0;
          if (uVar35 != 0) {
            for (; (uVar35 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
            }
          }
          uVar34 = *(ulong *)(uVar28 + lVar20 * 8);
          uVar35 = uVar35 - 1 & uVar35;
          context = (RayQueryContext *)(ulong)uVar35;
          if (uVar35 != 0) {
            do {
              *local_9f8 = uVar34;
              local_9f8 = local_9f8 + 1;
              lVar20 = 0;
              if (context != (RayQueryContext *)0x0) {
                for (; ((ulong)context >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                }
              }
              uVar34 = *(ulong *)(uVar28 + lVar20 * 8);
              context = (RayQueryContext *)((ulong)context & (ulong)((long)&context[-1].args + 7U));
            } while (context != (RayQueryContext *)0x0);
          }
        }
      }
      local_9e8 = (RayQueryContext *)((ulong)((uint)uVar34 & 0xf) - 8);
      if (local_9e8 != (RayQueryContext *)0x0) {
        uVar34 = uVar34 & 0xfffffffffffffff0;
        local_9e0 = (RayQueryContext *)0x0;
        local_978 = fVar99;
        fStack_974 = fVar83;
        fStack_970 = fVar88;
        fStack_96c = fVar91;
        pIVar30 = local_a58;
        puVar31 = local_9f8;
        uVar28 = local_a08;
        do {
          local_a98 = (long)local_9e0 * 0x140;
          fVar106 = *(float *)((long)&(pIVar30->collider).name + 4);
          pfVar9 = (float *)(uVar34 + 0x90 + local_a98);
          pfVar1 = (float *)(uVar34 + local_a98);
          pfVar10 = (float *)(uVar34 + 0xa0 + local_a98);
          pfVar8 = (float *)(uVar34 + 0x10 + local_a98);
          pfVar11 = (float *)(uVar34 + 0xb0 + local_a98);
          pfVar2 = (float *)(uVar34 + 0x20 + local_a98);
          pfVar12 = (float *)(uVar34 + 0xc0 + local_a98);
          pfVar3 = (float *)(uVar34 + 0x30 + local_a98);
          pfVar13 = (float *)(uVar34 + 0xd0 + local_a98);
          pfVar4 = (float *)(uVar34 + 0x40 + local_a98);
          pfVar14 = (float *)(uVar34 + 0xe0 + local_a98);
          pfVar5 = (float *)(uVar34 + 0x50 + local_a98);
          pfVar15 = (float *)(uVar34 + 0xf0 + local_a98);
          pfVar6 = (float *)(uVar34 + 0x60 + local_a98);
          pfVar16 = (float *)(uVar34 + 0x100 + local_a98);
          pfVar7 = (float *)(uVar34 + 0x70 + local_a98);
          pfVar17 = (float *)(uVar34 + 0x110 + local_a98);
          pfVar18 = (float *)(uVar34 + 0x80 + local_a98);
          fVar96 = *(float *)&pIVar30->ptr;
          fVar118 = *(float *)((long)&pIVar30->ptr + 4);
          fVar114 = *(float *)&pIVar30->leafIntersector;
          fVar104 = (*pfVar9 * fVar106 + *pfVar1) - fVar96;
          fVar107 = (pfVar9[1] * fVar106 + pfVar1[1]) - fVar96;
          fStack_a40 = (pfVar9[2] * fVar106 + pfVar1[2]) - fVar96;
          fStack_a3c = (pfVar9[3] * fVar106 + pfVar1[3]) - fVar96;
          fVar97 = (*pfVar10 * fVar106 + *pfVar8) - fVar118;
          fVar98 = (pfVar10[1] * fVar106 + pfVar8[1]) - fVar118;
          fStack_a50 = (pfVar10[2] * fVar106 + pfVar8[2]) - fVar118;
          fStack_a4c = (pfVar10[3] * fVar106 + pfVar8[3]) - fVar118;
          fVar58 = (*pfVar11 * fVar106 + *pfVar2) - fVar114;
          fVar62 = (pfVar11[1] * fVar106 + pfVar2[1]) - fVar114;
          fStack_9f0 = (pfVar11[2] * fVar106 + pfVar2[2]) - fVar114;
          fStack_9ec = (pfVar11[3] * fVar106 + pfVar2[3]) - fVar114;
          fVar75 = (*pfVar12 * fVar106 + *pfVar3) - fVar96;
          fVar78 = (pfVar12[1] * fVar106 + pfVar3[1]) - fVar96;
          fVar79 = (pfVar12[2] * fVar106 + pfVar3[2]) - fVar96;
          fVar80 = (pfVar12[3] * fVar106 + pfVar3[3]) - fVar96;
          fVar119 = (*pfVar13 * fVar106 + *pfVar4) - fVar118;
          fVar120 = (pfVar13[1] * fVar106 + pfVar4[1]) - fVar118;
          fVar121 = (pfVar13[2] * fVar106 + pfVar4[2]) - fVar118;
          fVar122 = (pfVar13[3] * fVar106 + pfVar4[3]) - fVar118;
          fVar81 = (*pfVar14 * fVar106 + *pfVar5) - fVar114;
          fVar86 = (pfVar14[1] * fVar106 + pfVar5[1]) - fVar114;
          fVar89 = (pfVar14[2] * fVar106 + pfVar5[2]) - fVar114;
          fVar90 = (pfVar14[3] * fVar106 + pfVar5[3]) - fVar114;
          fVar92 = (*pfVar15 * fVar106 + *pfVar6) - fVar96;
          fVar94 = (pfVar15[1] * fVar106 + pfVar6[1]) - fVar96;
          fVar95 = (pfVar15[2] * fVar106 + pfVar6[2]) - fVar96;
          fVar96 = (pfVar15[3] * fVar106 + pfVar6[3]) - fVar96;
          fVar115 = (*pfVar16 * fVar106 + *pfVar7) - fVar118;
          fVar116 = (pfVar16[1] * fVar106 + pfVar7[1]) - fVar118;
          fVar117 = (pfVar16[2] * fVar106 + pfVar7[2]) - fVar118;
          fVar118 = (pfVar16[3] * fVar106 + pfVar7[3]) - fVar118;
          fVar111 = (fVar106 * *pfVar17 + *pfVar18) - fVar114;
          fVar112 = (fVar106 * pfVar17[1] + pfVar18[1]) - fVar114;
          fVar113 = (fVar106 * pfVar17[2] + pfVar18[2]) - fVar114;
          fVar114 = (fVar106 * pfVar17[3] + pfVar18[3]) - fVar114;
          fVar63 = fVar92 - fVar104;
          fVar71 = fVar94 - fVar107;
          fStack_a00 = fVar95 - fStack_a40;
          fStack_9fc = fVar96 - fStack_a3c;
          fVar82 = fVar115 - fVar97;
          fVar87 = fVar116 - fVar98;
          fStack_a20 = fVar117 - fStack_a50;
          fStack_a1c = fVar118 - fStack_a4c;
          local_a18 = fVar111 - fVar58;
          fStack_a14 = fVar112 - fVar62;
          fStack_a10 = fVar113 - fStack_9f0;
          fStack_a0c = fVar114 - fStack_9ec;
          local_a28 = CONCAT44(fVar87,fVar82);
          local_a08 = CONCAT44(fVar71,fVar63);
          fVar106 = *(float *)&(pIVar30->collider).collide;
          fStack_a30 = *(float *)((long)&(pIVar30->collider).collide + 4);
          fStack_a90 = *(float *)&(pIVar30->collider).name;
          local_a38 = CONCAT44(fStack_a30,fStack_a30);
          fStack_a2c = fStack_a30;
          local_a68 = (fVar82 * (fVar111 + fVar58) - local_a18 * (fVar115 + fVar97)) * fVar106 +
                      (local_a18 * (fVar92 + fVar104) - (fVar111 + fVar58) * fVar63) * fStack_a30 +
                      ((fVar115 + fVar97) * fVar63 - (fVar92 + fVar104) * fVar82) * fStack_a90;
          fStack_a64 = (fVar87 * (fVar112 + fVar62) - fStack_a14 * (fVar116 + fVar98)) * fVar106 +
                       (fStack_a14 * (fVar94 + fVar107) - (fVar112 + fVar62) * fVar71) * fStack_a30
                       + ((fVar116 + fVar98) * fVar71 - (fVar94 + fVar107) * fVar87) * fStack_a90;
          fStack_a60 = (fStack_a20 * (fVar113 + fStack_9f0) - fStack_a10 * (fVar117 + fStack_a50)) *
                       fVar106 + (fStack_a10 * (fVar95 + fStack_a40) -
                                 (fVar113 + fStack_9f0) * fStack_a00) * fStack_a30 +
                                 ((fVar117 + fStack_a50) * fStack_a00 -
                                 (fVar95 + fStack_a40) * fStack_a20) * fStack_a90;
          fStack_a5c = (fStack_a1c * (fVar114 + fStack_9ec) - fStack_a0c * (fVar118 + fStack_a4c)) *
                       fVar106 + (fStack_a0c * (fVar96 + fStack_a3c) -
                                 (fVar114 + fStack_9ec) * fStack_9fc) * fStack_a30 +
                                 ((fVar118 + fStack_a4c) * fStack_9fc -
                                 (fVar96 + fStack_a3c) * fStack_a1c) * fStack_a90;
          fVar64 = fVar97 - fVar119;
          fVar72 = fVar98 - fVar120;
          fVar73 = fStack_a50 - fVar121;
          fVar74 = fStack_a4c - fVar122;
          local_8a8 = fVar58 - fVar81;
          fStack_8a4 = fVar62 - fVar86;
          fStack_8a0 = fStack_9f0 - fVar89;
          fStack_89c = fStack_9ec - fVar90;
          local_a58 = (Intersectors *)CONCAT44(fVar98,fVar97);
          local_9f8 = (ulong *)CONCAT44(fVar62,fVar58);
          fVar47 = fVar104 - fVar75;
          fVar49 = fVar107 - fVar78;
          fVar50 = fStack_a40 - fVar79;
          fVar51 = fStack_a3c - fVar80;
          local_a48 = (byte *)CONCAT44(fVar107,fVar104);
          local_a78._0_4_ =
               (fVar64 * (fVar58 + fVar81) - local_8a8 * (fVar97 + fVar119)) * fVar106 +
               (local_8a8 * (fVar104 + fVar75) - (fVar58 + fVar81) * fVar47) * fStack_a30 +
               ((fVar97 + fVar119) * fVar47 - (fVar104 + fVar75) * fVar64) * fStack_a90;
          local_a78._4_4_ =
               (fVar72 * (fVar62 + fVar86) - fStack_8a4 * (fVar98 + fVar120)) * fVar106 +
               (fStack_8a4 * (fVar107 + fVar78) - (fVar62 + fVar86) * fVar49) * fStack_a30 +
               ((fVar98 + fVar120) * fVar49 - (fVar107 + fVar78) * fVar72) * fStack_a90;
          local_a78._8_4_ =
               (fVar73 * (fStack_9f0 + fVar89) - fStack_8a0 * (fStack_a50 + fVar121)) * fVar106 +
               (fStack_8a0 * (fStack_a40 + fVar79) - (fStack_9f0 + fVar89) * fVar50) * fStack_a30 +
               ((fStack_a50 + fVar121) * fVar50 - (fStack_a40 + fVar79) * fVar73) * fStack_a90;
          local_a78._12_4_ =
               (fVar74 * (fStack_9ec + fVar90) - fStack_89c * (fStack_a4c + fVar122)) * fVar106 +
               (fStack_89c * (fStack_a3c + fVar80) - (fStack_9ec + fVar90) * fVar51) * fStack_a30 +
               ((fStack_a4c + fVar122) * fVar51 - (fStack_a3c + fVar80) * fVar74) * fStack_a90;
          fVar100 = fVar75 - fVar92;
          fVar101 = fVar78 - fVar94;
          fVar102 = fVar79 - fVar95;
          fVar103 = fVar80 - fVar96;
          fVar52 = fVar119 - fVar115;
          fVar55 = fVar120 - fVar116;
          fVar56 = fVar121 - fVar117;
          fVar57 = fVar122 - fVar118;
          fVar105 = fVar81 - fVar111;
          fVar108 = fVar86 - fVar112;
          fVar109 = fVar89 - fVar113;
          fVar110 = fVar90 - fVar114;
          auVar61._0_4_ =
               (fVar52 * (fVar111 + fVar81) - fVar105 * (fVar115 + fVar119)) * fVar106 +
               (fVar105 * (fVar92 + fVar75) - (fVar111 + fVar81) * fVar100) * fStack_a30 +
               ((fVar115 + fVar119) * fVar100 - (fVar92 + fVar75) * fVar52) * fStack_a90;
          auVar61._4_4_ =
               (fVar55 * (fVar112 + fVar86) - fVar108 * (fVar116 + fVar120)) * fVar106 +
               (fVar108 * (fVar94 + fVar78) - (fVar112 + fVar86) * fVar101) * fStack_a30 +
               ((fVar116 + fVar120) * fVar101 - (fVar94 + fVar78) * fVar55) * fStack_a90;
          auVar61._8_4_ =
               (fVar56 * (fVar113 + fVar89) - fVar109 * (fVar117 + fVar121)) * fVar106 +
               (fVar109 * (fVar95 + fVar79) - (fVar113 + fVar89) * fVar102) * fStack_a30 +
               ((fVar117 + fVar121) * fVar102 - (fVar95 + fVar79) * fVar56) * fStack_a90;
          auVar61._12_4_ =
               (fVar57 * (fVar114 + fVar90) - fVar110 * (fVar118 + fVar122)) * fVar106 +
               (fVar110 * (fVar96 + fVar80) - (fVar114 + fVar90) * fVar103) * fStack_a30 +
               ((fVar118 + fVar122) * fVar103 - (fVar96 + fVar80) * fVar57) * fStack_a90;
          auVar26._4_4_ = fStack_a64;
          auVar26._0_4_ = local_a68;
          auVar26._8_4_ = fStack_a60;
          auVar26._12_4_ = fStack_a5c;
          local_8b8 = local_a68 + local_a78._0_4_ + auVar61._0_4_;
          fStack_8b4 = fStack_a64 + local_a78._4_4_ + auVar61._4_4_;
          fStack_8b0 = fStack_a60 + local_a78._8_4_ + auVar61._8_4_;
          fStack_8ac = fStack_a5c + local_a78._12_4_ + auVar61._12_4_;
          auVar65 = minps(auVar26,local_a78);
          auVar60 = minps(auVar65,auVar61);
          auVar65 = maxps(auVar26,local_a78);
          auVar65 = maxps(auVar65,auVar61);
          local_8c8 = ABS(local_8b8);
          fStack_8c4 = ABS(fStack_8b4);
          fStack_8c0 = ABS(fStack_8b0);
          fStack_8bc = ABS(fStack_8ac);
          auVar93._0_4_ =
               -(uint)(auVar65._0_4_ <= local_8c8 * 1.1920929e-07 ||
                      -(local_8c8 * 1.1920929e-07) <= auVar60._0_4_) & local_898._0_4_;
          auVar93._4_4_ =
               -(uint)(auVar65._4_4_ <= fStack_8c4 * 1.1920929e-07 ||
                      -(fStack_8c4 * 1.1920929e-07) <= auVar60._4_4_) & local_898._4_4_;
          auVar93._8_4_ =
               -(uint)(auVar65._8_4_ <= fStack_8c0 * 1.1920929e-07 ||
                      -(fStack_8c0 * 1.1920929e-07) <= auVar60._8_4_) & local_898._8_4_;
          auVar93._12_4_ =
               -(uint)(auVar65._12_4_ <= fStack_8bc * 1.1920929e-07 ||
                      -(fStack_8bc * 1.1920929e-07) <= auVar60._12_4_) & local_898._12_4_;
          iVar27 = movmskps((int)local_9e0,auVar93);
          local_a58 = pIVar30;
          local_9f8 = puVar31;
          local_a08 = uVar28;
          if (iVar27 != 0) {
            uVar35 = -(uint)(ABS(local_8a8 * fVar52) <= ABS(local_a18 * fVar64));
            uVar43 = -(uint)(ABS(fStack_8a4 * fVar55) <= ABS(fStack_a14 * fVar72));
            uVar40 = -(uint)(ABS(fStack_8a0 * fVar56) <= ABS(fStack_a10 * fVar73));
            uVar44 = -(uint)(ABS(fStack_89c * fVar57) <= ABS(fStack_a0c * fVar74));
            uVar36 = -(uint)(ABS(fVar47 * fVar105) <= ABS(fVar63 * local_8a8));
            uVar37 = -(uint)(ABS(fVar49 * fVar108) <= ABS(fVar71 * fStack_8a4));
            uVar41 = -(uint)(ABS(fVar50 * fVar109) <= ABS(fStack_a00 * fStack_8a0));
            uVar45 = -(uint)(ABS(fVar51 * fVar110) <= ABS(fStack_9fc * fStack_89c));
            uVar39 = -(uint)(ABS(fVar64 * fVar100) <= ABS(fVar82 * fVar47));
            uVar38 = -(uint)(ABS(fVar72 * fVar101) <= ABS(fVar87 * fVar49));
            uVar42 = -(uint)(ABS(fVar73 * fVar102) <= ABS(fStack_a20 * fVar50));
            uVar46 = -(uint)(ABS(fVar74 * fVar103) <= ABS(fStack_a1c * fVar51));
            auVar70._0_4_ = (uint)(fVar64 * fVar105 - local_8a8 * fVar52) & uVar35;
            auVar70._4_4_ = (uint)(fVar72 * fVar108 - fStack_8a4 * fVar55) & uVar43;
            auVar70._8_4_ = (uint)(fVar73 * fVar109 - fStack_8a0 * fVar56) & uVar40;
            auVar70._12_4_ = (uint)(fVar74 * fVar110 - fStack_89c * fVar57) & uVar44;
            local_808._0_4_ = ~uVar35 & (uint)(fVar82 * local_8a8 - local_a18 * fVar64);
            local_808._4_4_ = ~uVar43 & (uint)(fVar87 * fStack_8a4 - fStack_a14 * fVar72);
            local_808._8_4_ = ~uVar40 & (uint)(fStack_a20 * fStack_8a0 - fStack_a10 * fVar73);
            local_808._12_4_ = ~uVar44 & (uint)(fStack_a1c * fStack_89c - fStack_a0c * fVar74);
            local_808 = local_808 | auVar70;
            local_7f8[0] = (float)(~uVar36 & (uint)(local_a18 * fVar47 - fVar63 * local_8a8) |
                                  (uint)(local_8a8 * fVar100 - fVar47 * fVar105) & uVar36);
            local_7f8[1] = (float)(~uVar37 & (uint)(fStack_a14 * fVar49 - fVar71 * fStack_8a4) |
                                  (uint)(fStack_8a4 * fVar101 - fVar49 * fVar108) & uVar37);
            local_7f8[2] = (float)(~uVar41 & (uint)(fStack_a10 * fVar50 - fStack_a00 * fStack_8a0) |
                                  (uint)(fStack_8a0 * fVar102 - fVar50 * fVar109) & uVar41);
            local_7f8[3] = (float)(~uVar45 & (uint)(fStack_a0c * fVar51 - fStack_9fc * fStack_89c) |
                                  (uint)(fStack_89c * fVar103 - fVar51 * fVar110) & uVar45);
            local_7e8[0] = (float)(~uVar39 & (uint)(fVar63 * fVar64 - fVar82 * fVar47) |
                                  (uint)(fVar47 * fVar52 - fVar64 * fVar100) & uVar39);
            local_7e8[1] = (float)(~uVar38 & (uint)(fVar71 * fVar72 - fVar87 * fVar49) |
                                  (uint)(fVar49 * fVar55 - fVar72 * fVar101) & uVar38);
            local_7e8[2] = (float)(~uVar42 & (uint)(fStack_a00 * fVar73 - fStack_a20 * fVar50) |
                                  (uint)(fVar50 * fVar56 - fVar73 * fVar102) & uVar42);
            local_7e8[3] = (float)(~uVar46 & (uint)(fStack_9fc * fVar74 - fStack_a1c * fVar51) |
                                  (uint)(fVar51 * fVar57 - fVar74 * fVar103) & uVar46);
            fVar83 = fVar106 * local_808._0_4_ +
                     fStack_a30 * local_7f8[0] + fStack_a90 * local_7e8[0];
            fVar88 = fVar106 * local_808._4_4_ +
                     fStack_a30 * local_7f8[1] + fStack_a90 * local_7e8[1];
            fVar99 = fVar106 * local_808._8_4_ +
                     fStack_a30 * local_7f8[2] + fStack_a90 * local_7e8[2];
            fVar91 = fVar106 * local_808._12_4_ +
                     fStack_a30 * local_7f8[3] + fStack_a90 * local_7e8[3];
            auVar84._0_4_ = fVar83 + fVar83;
            auVar84._4_4_ = fVar88 + fVar88;
            auVar84._8_4_ = fVar99 + fVar99;
            auVar84._12_4_ = fVar91 + fVar91;
            auVar54._0_4_ = fVar58 * local_7e8[0];
            auVar54._4_4_ = fVar62 * local_7e8[1];
            auVar54._8_4_ = fStack_9f0 * local_7e8[2];
            auVar54._12_4_ = fStack_9ec * local_7e8[3];
            fVar106 = fVar104 * local_808._0_4_ + fVar97 * local_7f8[0] + auVar54._0_4_;
            fVar96 = fVar107 * local_808._4_4_ + fVar98 * local_7f8[1] + auVar54._4_4_;
            fVar118 = fStack_a40 * local_808._8_4_ + fStack_a50 * local_7f8[2] + auVar54._8_4_;
            fVar114 = fStack_a3c * local_808._12_4_ + fStack_a4c * local_7f8[3] + auVar54._12_4_;
            auVar65 = rcpps(auVar54,auVar84);
            fVar83 = auVar65._0_4_;
            fVar88 = auVar65._4_4_;
            fVar99 = auVar65._8_4_;
            fVar91 = auVar65._12_4_;
            local_818._0_4_ =
                 (((float)DAT_01f7ba10 - auVar84._0_4_ * fVar83) * fVar83 + fVar83) *
                 (fVar106 + fVar106);
            local_818._4_4_ =
                 ((DAT_01f7ba10._4_4_ - auVar84._4_4_ * fVar88) * fVar88 + fVar88) *
                 (fVar96 + fVar96);
            local_818._8_4_ =
                 ((DAT_01f7ba10._8_4_ - auVar84._8_4_ * fVar99) * fVar99 + fVar99) *
                 (fVar118 + fVar118);
            local_818._12_4_ =
                 ((DAT_01f7ba10._12_4_ - auVar84._12_4_ * fVar91) * fVar91 + fVar91) *
                 (fVar114 + fVar114);
            fVar83 = *(float *)&(pIVar30->intersector1).intersect;
            fVar88 = *(float *)((long)&pIVar30->leafIntersector + 4);
            auVar85._0_4_ =
                 (int)((uint)(auVar84._0_4_ != 0.0 &&
                             (local_818._0_4_ <= fVar83 && fVar88 <= local_818._0_4_)) * -0x80000000
                      ) >> 0x1f;
            auVar85._4_4_ =
                 (int)((uint)(auVar84._4_4_ != 0.0 &&
                             (local_818._4_4_ <= fVar83 && fVar88 <= local_818._4_4_)) * -0x80000000
                      ) >> 0x1f;
            auVar85._8_4_ =
                 (int)((uint)(auVar84._8_4_ != 0.0 &&
                             (local_818._8_4_ <= fVar83 && fVar88 <= local_818._8_4_)) * -0x80000000
                      ) >> 0x1f;
            auVar85._12_4_ =
                 (int)((uint)(auVar84._12_4_ != 0.0 &&
                             (local_818._12_4_ <= fVar83 && fVar88 <= local_818._12_4_)) *
                      -0x80000000) >> 0x1f;
            uVar35 = movmskps(iVar27,auVar85 & auVar93);
            fVar99 = local_978;
            fVar83 = fStack_974;
            fVar88 = fStack_970;
            fVar91 = fStack_96c;
            if (uVar35 != 0) {
              local_a98 = local_a98 + uVar34;
              local_888 = local_a68;
              fStack_884 = fStack_a64;
              fStack_880 = fStack_a60;
              fStack_87c = fStack_a5c;
              local_878 = local_a78;
              local_868._4_4_ = fStack_8b4;
              local_868._0_4_ = local_8b8;
              local_868._8_4_ = fStack_8b0;
              local_868._12_4_ = fStack_8ac;
              local_858 = &local_a99;
              local_848 = auVar85 & auVar93;
              auVar65 = rcpps(local_818,local_868);
              fVar106 = auVar65._0_4_;
              fVar96 = auVar65._4_4_;
              fVar118 = auVar65._8_4_;
              fVar114 = auVar65._12_4_;
              fVar106 = (float)(-(uint)(1e-18 <= local_8c8) &
                               (uint)(((float)DAT_01f7ba10 - local_8b8 * fVar106) * fVar106 +
                                     fVar106));
              fVar96 = (float)(-(uint)(1e-18 <= fStack_8c4) &
                              (uint)((DAT_01f7ba10._4_4_ - fStack_8b4 * fVar96) * fVar96 + fVar96));
              fVar118 = (float)(-(uint)(1e-18 <= fStack_8c0) &
                               (uint)((DAT_01f7ba10._8_4_ - fStack_8b0 * fVar118) * fVar118 +
                                     fVar118));
              fVar114 = (float)(-(uint)(1e-18 <= fStack_8bc) &
                               (uint)((DAT_01f7ba10._12_4_ - fStack_8ac * fVar114) * fVar114 +
                                     fVar114));
              auVar77._0_4_ = local_a68 * fVar106;
              auVar77._4_4_ = fStack_a64 * fVar96;
              auVar77._8_4_ = fStack_a60 * fVar118;
              auVar77._12_4_ = fStack_a5c * fVar114;
              local_838 = minps(auVar77,_DAT_01f7ba10);
              auVar48._0_4_ = fVar106 * local_a78._0_4_;
              auVar48._4_4_ = fVar96 * local_a78._4_4_;
              auVar48._8_4_ = fVar118 * local_a78._8_4_;
              auVar48._12_4_ = fVar114 * local_a78._12_4_;
              local_828 = minps(auVar48,_DAT_01f7ba10);
              uVar28 = (ulong)(uVar35 & 0xff);
              local_a38 = *(long *)&(local_a88->org).field_0;
              fStack_a8c = fStack_a90;
              do {
                uVar21 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                  }
                }
                local_9c0 = *(uint *)(local_a98 + 0x120 + uVar21 * 4);
                local_a28 = *(long *)(*(long *)(local_a38 + 0x1e8) + (ulong)local_9c0 * 8);
                if ((*(uint *)(local_a28 + 0x34) &
                    *(uint *)((long)&(local_a58->intersector1).intersect + 4)) == 0) {
                  uVar28 = uVar28 ^ 1L << (uVar21 & 0x3f);
                }
                else {
                  local_a68 = (float)uVar21;
                  fStack_a64 = (float)(uVar21 >> 0x20);
                  local_a78._0_8_ = uVar28;
                  local_a48 = *(byte **)&(local_a88->dir).field_0;
                  if ((*(long *)(local_a48 + 0x10) == 0) && (*(long *)(local_a28 + 0x48) == 0)) {
LAB_0019287d:
                    *(undefined4 *)&(local_a58->intersector1).intersect = 0xff800000;
                    return;
                  }
                  local_998 = *(undefined4 **)((long)&(local_a88->org).field_0 + 8);
                  local_9d8 = *(undefined4 *)(local_808 + uVar21 * 4);
                  local_9d4 = local_7f8[uVar21];
                  local_9d0 = local_7e8[uVar21];
                  local_9cc = *(undefined4 *)(local_838 + uVar21 * 4);
                  local_9c8 = *(undefined4 *)(local_828 + uVar21 * 4);
                  local_9c4 = *(undefined4 *)(local_a98 + 0x130 + uVar21 * 4);
                  local_9bc = *local_998;
                  local_9b8 = local_998[1];
                  local_a18 = (float)*(undefined4 *)&(local_a58->intersector1).intersect;
                  *(undefined4 *)&(local_a58->intersector1).intersect =
                       *(undefined4 *)(local_818 + uVar21 * 4);
                  local_a7c = -1;
                  local_9a8 = &local_a7c;
                  local_9a0 = *(undefined8 *)(local_a28 + 0x18);
                  local_988 = &local_9d8;
                  local_980 = 1;
                  local_990 = local_a58;
                  if (((*(code **)(local_a28 + 0x48) == (code *)0x0) ||
                      ((**(code **)(local_a28 + 0x48))(&local_9a8), *local_9a8 != 0)) &&
                     ((*(code **)(local_a48 + 0x10) == (code *)0x0 ||
                      ((((*local_a48 & 2) == 0 && ((*(byte *)(local_a28 + 0x3e) & 0x40) == 0)) ||
                       ((**(code **)(local_a48 + 0x10))(&local_9a8), *local_9a8 != 0))))))
                  goto LAB_0019287d;
                  *(float *)&(local_a58->intersector1).intersect = local_a18;
                  uVar28 = local_a78._0_8_ ^ 1L << ((ulong)(uint)local_a68 & 0x3f);
                  fVar99 = local_978;
                  fVar83 = fStack_974;
                  fVar88 = fStack_970;
                  fVar91 = fStack_96c;
                }
              } while (uVar28 != 0);
            }
          }
          local_9e0 = (RayQueryContext *)((long)&local_9e0->scene + 1);
          pIVar30 = local_a58;
          puVar31 = local_9f8;
          uVar28 = local_a08;
        } while (local_9e0 != local_9e8);
      }
LAB_0019286d:
      context = local_9e8;
    } while (local_9f8 != &local_7d8);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }